

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O1

void __thiscall wasm::TypeBuilder::setHeapType(TypeBuilder *this,size_t i,Continuation continuation)

{
  _Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> _Var1;
  long lVar2;
  HeapTypeInfo local_60;
  
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
       .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
  lVar2 = *(long *)&((_Var1._M_head_impl)->entries).
                    super__Vector_base<wasm::TypeBuilder::Impl::Entry,_std::allocator<wasm::TypeBuilder::Impl::Entry>_>
  ;
  if (i < (ulong)((long)*(pointer *)((long)&(_Var1._M_head_impl)->entries + 8) - lVar2 >> 4)) {
    local_60.isTemp = false;
    local_60.isOpen = false;
    local_60.share = Unshared;
    local_60.supertype = (HeapTypeInfo *)0x0;
    local_60.descriptor = (HeapTypeInfo *)0x0;
    local_60.described = (HeapTypeInfo *)0x0;
    local_60.recGroup = (RecGroupInfo_conflict *)0x0;
    local_60.recGroupIndex = 0;
    local_60.kind = Cont;
    local_60.field_9.continuation.type.id = (Continuation)continuation.type.id;
    Impl::Entry::set((Entry *)(lVar2 + i * 0x10),&local_60);
    anon_unknown_0::HeapTypeInfo::~HeapTypeInfo(&local_60);
    return;
  }
  __assert_fail("i < size() && \"index out of bounds\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                ,0x8ff,"void wasm::TypeBuilder::setHeapType(size_t, Continuation)");
}

Assistant:

void TypeBuilder::setHeapType(size_t i, Continuation continuation) {
  assert(i < size() && "index out of bounds");
  impl->entries[i].set(continuation);
}